

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O2

void __thiscall UnifiedRegex::RegexPattern::Print(RegexPattern *this,DebugWriter *w)

{
  Char c;
  code *pcVar1;
  bool bVar2;
  Type TVar3;
  undefined4 *puVar4;
  ulong uVar5;
  char16_t *form;
  uint uVar6;
  uint uVar7;
  InternalString IVar8;
  uint local_40;
  byte local_3c;
  InternalString str;
  
  DebugWriter::Print(w,L"/");
  IVar8 = GetSource((RegexPattern *)&local_40);
  uVar7 = local_40;
  if (local_40 == 0) {
    DebugWriter::Print(w,L"(?:)",IVar8.m_content.ptr.ptr);
  }
  else {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    for (uVar6 = 0; uVar6 < uVar7; uVar6 = uVar6 + 1) {
      uVar5 = (ulong)local_3c;
      c = *(Char *)(str._0_8_ + uVar5 * 2 + (ulong)uVar6 * 2);
      if ((((ushort)c - 0x2028 < 2) || (c == L'\n')) || (c == L'\r')) {
LAB_00d39b4c:
        DebugWriter::PrintEscapedChar(w,c);
      }
      else if (c == L'-') {
        DebugWriter::Print(w,L"-");
      }
      else {
        if (c == L'\\') {
          uVar6 = uVar6 + 1;
          if (uVar7 <= uVar6) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexPattern.cpp"
                               ,0xbe,"(i + 1 < str.GetLength())","i + 1 < str.GetLength()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar4 = 0;
            uVar5 = (ulong)local_3c;
          }
          uVar5 = (ulong)*(ushort *)(str._0_8_ + uVar5 * 2 + (ulong)uVar6 * 2);
        }
        else {
          if (c != L'/') goto LAB_00d39b4c;
          uVar5 = 0x2f;
        }
        DebugWriter::Print(w,L"\\%lc",uVar5);
      }
      uVar7 = local_40;
    }
  }
  DebugWriter::Print(w,L"/");
  TVar3 = ((this->rep).unified.program.ptr)->flags;
  if ((TVar3 & IgnoreCaseRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"i");
    TVar3 = ((this->rep).unified.program.ptr)->flags;
  }
  if ((TVar3 & GlobalRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"g");
    TVar3 = ((this->rep).unified.program.ptr)->flags;
  }
  if ((TVar3 & MultilineRegexFlag) != NoRegexFlags) {
    DebugWriter::Print(w,L"m");
  }
  bVar2 = IsDotAll(this);
  if (bVar2) {
    DebugWriter::Print(w,L"s");
  }
  bVar2 = IsUnicode(this);
  if (bVar2) {
    DebugWriter::Print(w,L"u");
  }
  bVar2 = IsSticky(this);
  if (bVar2) {
    DebugWriter::Print(w,L"y");
  }
  DebugWriter::Print(w,L" /* ");
  DebugWriter::Print(w,L", ");
  form = L"dynamic";
  if ((this->field_0x18 & 1) != 0) {
    form = L"literal";
  }
  DebugWriter::Print(w,form);
  DebugWriter::Print(w,L" */");
  return;
}

Assistant:

void RegexPattern::Print(DebugWriter* w)
    {
        w->Print(_u("/"));

        Js::InternalString str = GetSource();
        if (str.GetLength() == 0)
            w->Print(_u("(?:)"));
        else
        {
            for (charcount_t i = 0; i < str.GetLength(); ++i)
            {
                const char16 c = str.GetBuffer()[i];
                switch(c)
                {
                case _u('/'):
                    w->Print(_u("\\%lc"), c);
                    break;
                case _u('\n'):
                case _u('\r'):
                case _u('\x2028'):
                case _u('\x2029'):
                    w->PrintEscapedChar(c);
                    break;
                case _u('-'):
                    w->Print(_u("-"));
                    break;
                case _u('\\'):
                    Assert(i + 1 < str.GetLength()); // cannot end in a '\'
                    w->Print(_u("\\%lc"), str.GetBuffer()[++i]);
                    break;
                default:
                    w->PrintEscapedChar(c);
                    break;
                }
            }
        }
        w->Print(_u("/"));
        if (IsIgnoreCase())
            w->Print(_u("i"));
        if (IsGlobal())
            w->Print(_u("g"));
        if (IsMultiline())
            w->Print(_u("m"));
        if (IsDotAll())
            w->Print(_u("s"));
        if (IsUnicode())
            w->Print(_u("u"));
        if (IsSticky())
            w->Print(_u("y"));
        w->Print(_u(" /* "));
        w->Print(_u(", "));
        w->Print(isLiteral ? _u("literal") : _u("dynamic"));
        w->Print(_u(" */"));
    }